

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choc_Value.h
# Opt level: O2

void __thiscall choc::value::Type::Object::~Object(Object *this)

{
  AllocatedVector<choc::value::MemberNameAndType> *__range2;
  long lVar1;
  MemberNameAndType *m;
  MemberNameAndType *pMVar2;
  
  anon_unknown_11::freeBytes((this->members).allocator,(this->className)._M_str);
  pMVar2 = (this->members).items;
  for (lVar1 = (ulong)(this->members).size * 0x30; lVar1 != 0; lVar1 = lVar1 + -0x30) {
    anon_unknown_11::freeBytes((this->members).allocator,(pMVar2->name)._M_str);
    pMVar2 = pMVar2 + 1;
  }
  AllocatedVector<choc::value::MemberNameAndType>::~AllocatedVector(&this->members);
  return;
}

Assistant:

~Object() noexcept
    {
        freeString (members.allocator, className);

        for (auto& m : members)
            freeString (members.allocator, m.name);
    }